

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_widget_is_hovered(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_window *pnVar6;
  nk_panel *pnVar7;
  undefined1 auVar8 [16];
  undefined4 extraout_EAX;
  int iVar9;
  uint uVar10;
  nk_rect bounds;
  nk_rect local_48;
  float local_38;
  float fStack_34;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  undefined8 uStack_20;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4ef8,"int nk_widget_is_hovered(struct nk_context *)");
  }
  pnVar6 = ctx->current;
  if (pnVar6 != (nk_window *)0x0) {
    uVar10 = 0;
    if (ctx->active == pnVar6) {
      pnVar7 = pnVar6->layout;
      uVar2 = (pnVar7->clip).x;
      uVar4 = (pnVar7->clip).y;
      uVar3 = (pnVar7->clip).w;
      uVar5 = (pnVar7->clip).h;
      local_38 = (float)(int)(float)uVar2;
      fStack_34 = (float)(int)(float)uVar4;
      uStack_30 = 0;
      local_28 = (float)(int)(float)uVar3;
      fStack_24 = (float)(int)(float)uVar5;
      uStack_20 = 0;
      nk_layout_peek(&local_48,ctx);
      auVar8._4_4_ = -(uint)(fStack_24 + fStack_34 < local_48.y);
      auVar8._0_4_ = -(uint)(local_28 + local_38 < local_48.x);
      auVar8._8_4_ = -(uint)(local_48.w + local_48.x < local_38);
      auVar8._12_4_ = -(uint)(local_48.h + local_48.y < fStack_34);
      iVar9 = movmskps(extraout_EAX,auVar8);
      if (iVar9 == 0) {
        fVar1 = (ctx->input).mouse.pos.x;
        if (((local_48.x <= fVar1) && (uVar10 = 0, fVar1 < local_48.x + local_48.w)) &&
           (fVar1 = (ctx->input).mouse.pos.y, local_48.y <= fVar1)) {
          uVar10 = (uint)(fVar1 < local_48.y + local_48.h);
        }
      }
    }
    return uVar10;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4ef9,"int nk_widget_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
}